

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Segment::Load(Segment *this)

{
  long in_RDI;
  long status;
  longlong header_status;
  Segment *in_stack_00000148;
  Segment *in_stack_ffffffffffffffe0;
  longlong local_8;
  
  if (((*(long *)(in_RDI + 0xa8) == 0) && (*(long *)(in_RDI + 0xc0) == 0)) &&
     (*(long *)(in_RDI + 0xb0) == 0)) {
    local_8 = ParseHeaders(in_stack_00000148);
    if (-1 < local_8) {
      if (local_8 < 1) {
        if ((*(long *)(in_RDI + 0x80) == 0) || (*(long *)(in_RDI + 0x88) == 0)) {
          local_8 = -2;
        }
        else {
          do {
            in_stack_ffffffffffffffe0 = (Segment *)LoadCluster(in_stack_ffffffffffffffe0);
            if ((long)in_stack_ffffffffffffffe0 < 0) {
              return (long)in_stack_ffffffffffffffe0;
            }
          } while ((long)in_stack_ffffffffffffffe0 < 1);
          local_8 = 0;
        }
      }
      else {
        local_8 = -3;
      }
    }
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

long Segment::Load() {
  if (m_clusters != NULL || m_clusterSize != 0 || m_clusterCount != 0)
    return E_PARSE_FAILED;

  // Outermost (level 0) segment object has been constructed,
  // and pos designates start of payload.  We need to find the
  // inner (level 1) elements.

  const long long header_status = ParseHeaders();

  if (header_status < 0)  // error
    return static_cast<long>(header_status);

  if (header_status > 0)  // underflow
    return E_BUFFER_NOT_FULL;

  if (m_pInfo == NULL || m_pTracks == NULL)
    return E_FILE_FORMAT_INVALID;

  for (;;) {
    const long status = LoadCluster();

    if (status < 0)  // error
      return status;

    if (status >= 1)  // no more clusters
      return 0;
  }
}